

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

void us_internal_socket_context_link(us_socket_context_t *context,us_socket_t *s)

{
  us_socket_t *puVar1;
  
  s->context = context;
  s->timeout = 0;
  puVar1 = context->head;
  s->next = puVar1;
  s->prev = (us_socket_t *)0x0;
  if (puVar1 != (us_socket_t *)0x0) {
    puVar1->prev = s;
  }
  context->head = s;
  return;
}

Assistant:

void us_internal_socket_context_link(struct us_socket_context_t *context, struct us_socket_t *s) {
    s->context = context;
    s->timeout = 0;
    s->next = context->head;
    s->prev = 0;
    if (context->head) {
        context->head->prev = s;
    }
    context->head = s;
}